

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Run.h
# Opt level: O0

void gurkenlaeufer::runScenario(Scenario *scenario)

{
  pointer psVar1;
  ostream *poVar2;
  list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> *plVar3;
  StepRegistry *registry;
  StepRegistry *registry_00;
  StepRegistry *registry_01;
  undefined1 local_28 [8];
  ScenarioContext scenarioContext;
  Scenario *scenario_local;
  
  scenarioContext._fixtures.
  super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)scenario;
  detail::ScenarioContext::ScenarioContext((ScenarioContext *)local_28);
  poVar2 = std::operator<<((ostream *)&std::cout,"[");
  poVar2 = std::operator<<(poVar2,(string *)
                                  scenarioContext._fixtures.
                                  super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar2 = std::operator<<(poVar2,"]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  plVar3 = (list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> *)
           (scenarioContext._fixtures.
            super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
  registry = detail::CommonStep<gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>>
             ::getStepRegistry_abi_cxx11_();
  detail::
  runStepList<std::__cxx11::list<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>,std::allocator<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)0>*>>>>
            ((ScenarioContext *)local_28,plVar3,registry,true);
  psVar1 = scenarioContext._fixtures.
           super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 3;
  registry_00 = detail::CommonStep<gurkenlaeufer::detail::BaseStep>::getStepRegistry_abi_cxx11_();
  detail::
  runStepList<std::__cxx11::list<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseStep*>,std::allocator<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseStep*>>>>
            ((ScenarioContext *)local_28,
             (list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> *)
             &(psVar1->
              super___shared_ptr<gurkenlaeufer::detail::IFixture,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount,registry_00,false);
  plVar3 = (list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> *)
           (scenarioContext._fixtures.
            super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
  registry_01 = detail::
                CommonStep<gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)1>>::
                getStepRegistry_abi_cxx11_();
  detail::
  runStepList<std::__cxx11::list<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)1>*>,std::allocator<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseHook<(gurkenlaeufer::detail::Hooktype)1>*>>>>
            ((ScenarioContext *)local_28,plVar3,registry_01,true);
  detail::ScenarioContext::~ScenarioContext((ScenarioContext *)local_28);
  return;
}

Assistant:

void runScenario(const Scenario& scenario)
{
    detail::ScenarioContext scenarioContext;
    std::cout << "[" << scenario.description << "]" << std::endl;
    detail::runStepList(scenarioContext, scenario.tags, detail::BaseHook<detail::Hooktype::Before>::getStepRegistry(), true);
    detail::runStepList(scenarioContext, scenario.mainSteps, detail::BaseStep::getStepRegistry(), false);
    detail::runStepList(scenarioContext, scenario.tags, detail::BaseHook<detail::Hooktype::After>::getStepRegistry(), true);
}